

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

void __thiscall
JsrtDebuggerObjectGlobalsNode::~JsrtDebuggerObjectGlobalsNode(JsrtDebuggerObjectGlobalsNode *this)

{
  JsrtDebuggerObjectGlobalsNode *this_local;
  
  ~JsrtDebuggerObjectGlobalsNode(this);
  operator_delete(this);
  return;
}

Assistant:

JsrtDebuggerObjectGlobalsNode::~JsrtDebuggerObjectGlobalsNode()
{
    if (this->objectDisplay != nullptr)
    {
        HeapDelete(this->objectDisplay);
        this->objectDisplay = nullptr;
    }

    if (this->walkerRef != nullptr)
    {
        HeapDelete(this->walkerRef);
        this->walkerRef = nullptr;
    }
}